

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-env-vars.c
# Opt level: O2

int run_test_env_vars(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  undefined8 uStack_60;
  long local_58;
  char buf [10];
  int envcount;
  long local_40;
  uv_env_item_t *envitems;
  
  iVar1 = uv_os_setenv(0,"foo");
  if (iVar1 == -0x16) {
    iVar1 = uv_os_setenv("UV_TEST_FOO",0);
    if (iVar1 == -0x16) {
      iVar1 = uv_os_setenv(0,0);
      if (iVar1 == -0x16) {
        local_58 = 10;
        iVar1 = uv_os_getenv(0,buf);
        if (iVar1 == -0x16) {
          iVar1 = uv_os_getenv("UV_TEST_FOO",0,&local_58);
          if (iVar1 == -0x16) {
            iVar1 = uv_os_getenv("UV_TEST_FOO",buf,0);
            if (iVar1 == -0x16) {
              local_58 = 0;
              iVar1 = uv_os_getenv("UV_TEST_FOO",buf);
              if (iVar1 == -0x16) {
                iVar1 = uv_os_unsetenv(0);
                if (iVar1 == -0x16) {
                  iVar1 = uv_os_setenv("UV_TEST_FOO","123456789");
                  if (iVar1 == 0) {
                    local_58 = 10;
                    buf[0] = '\0';
                    iVar1 = uv_os_getenv("UV_TEST_FOO");
                    if (iVar1 == 0) {
                      iVar1 = bcmp(buf,"123456789",10);
                      if (iVar1 == 0) {
                        if (local_58 == 9) {
                          buf[0] = '\0';
                          iVar1 = uv_os_getenv("UV_TEST_FOO",buf,&local_58);
                          if (iVar1 == -0x69) {
                            if (local_58 == 10) {
                              iVar1 = uv_os_unsetenv("UV_TEST_FOO");
                              if (iVar1 == 0) {
                                iVar1 = uv_os_getenv("UV_TEST_FOO",buf,&local_58);
                                if (iVar1 == -2) {
                                  iVar1 = uv_os_unsetenv("UV_TEST_FOO");
                                  if (iVar1 == 0) {
                                    iVar1 = uv_os_setenv("UV_TEST_FOO","");
                                    if (iVar1 == 0) {
                                      local_58 = 10;
                                      iVar1 = uv_os_getenv("UV_TEST_FOO",buf);
                                      if (iVar1 == 0) {
                                        if (local_58 == 0) {
                                          if (buf[0] == '\0') {
                                            iVar1 = uv_os_setenv("UV_TEST_FOO","123456789");
                                            if (iVar1 == 0) {
                                              iVar1 = uv_os_setenv("UV_TEST_FOO2","");
                                              if (iVar1 == 0) {
                                                iVar1 = uv_os_environ(&envitems,&envcount);
                                                if (iVar1 == 0) {
                                                  lVar3 = (long)envcount;
                                                  if (lVar3 < 1) {
                                                    pcVar4 = "envcount > 0";
                                                    uStack_60 = 0x72;
                                                  }
                                                  else {
                                                    iVar1 = 0;
                                                    local_40 = lVar3;
                                                    for (lVar5 = 0; lVar3 * 0x10 != lVar5;
                                                        lVar5 = lVar5 + 0x10) {
                                                      pcVar4 = *(char **)((long)&envitems->name +
                                                                         lVar5);
                                                      iVar2 = strcmp(pcVar4,"UV_TEST_FOO");
                                                      if (iVar2 == 0) {
                                                        iVar2 = strcmp(*(char **)((long)&envitems->
                                                                                         value +
                                                                                 lVar5),"123456789")
                                                        ;
                                                        if (iVar2 != 0) {
                                                          pcVar4 = 
                                                  "strcmp(envitems[i].value, \"123456789\") == 0";
                                                  uStack_60 = 0x7b;
                                                  goto LAB_00116fbf;
                                                  }
LAB_00116f21:
                                                  iVar1 = iVar1 + 1;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(pcVar4,"UV_TEST_FOO2");
                                                    if (iVar2 == 0) {
                                                      if (**(char **)((long)&envitems->value + lVar5
                                                                     ) == '\0') goto LAB_00116f21;
                                                      pcVar4 = "strlen(envitems[i].value) == 0";
                                                      uStack_60 = 0x7e;
                                                      goto LAB_00116fbf;
                                                    }
                                                  }
                                                  }
                                                  if (iVar1 == 2) {
                                                    uv_os_free_environ(envitems,local_40);
                                                    iVar1 = uv_os_unsetenv("UV_TEST_FOO");
                                                    if (iVar1 == 0) {
                                                      iVar1 = uv_os_unsetenv("UV_TEST_FOO2");
                                                      if (iVar1 == 0) {
                                                        return 0;
                                                      }
                                                      pcVar4 = "r == 0";
                                                      uStack_60 = 0x8f;
                                                    }
                                                    else {
                                                      pcVar4 = "r == 0";
                                                      uStack_60 = 0x8c;
                                                    }
                                                  }
                                                  else {
                                                    pcVar4 = "found == 2";
                                                    uStack_60 = 0x84;
                                                  }
                                                  }
                                                }
                                                else {
                                                  pcVar4 = "r == 0";
                                                  uStack_60 = 0x71;
                                                }
                                              }
                                              else {
                                                pcVar4 = "r == 0";
                                                uStack_60 = 0x68;
                                              }
                                            }
                                            else {
                                              pcVar4 = "r == 0";
                                              uStack_60 = 0x66;
                                            }
                                          }
                                          else {
                                            pcVar4 = "strlen(buf) == 0";
                                            uStack_60 = 0x62;
                                          }
                                        }
                                        else {
                                          pcVar4 = "size == 0";
                                          uStack_60 = 0x61;
                                        }
                                      }
                                      else {
                                        pcVar4 = "r == 0";
                                        uStack_60 = 0x60;
                                      }
                                    }
                                    else {
                                      pcVar4 = "r == 0";
                                      uStack_60 = 0x5d;
                                    }
                                  }
                                  else {
                                    pcVar4 = "r == 0";
                                    uStack_60 = 0x59;
                                  }
                                }
                                else {
                                  pcVar4 = "r == UV_ENOENT";
                                  uStack_60 = 0x55;
                                }
                              }
                              else {
                                pcVar4 = "r == 0";
                                uStack_60 = 0x51;
                              }
                            }
                            else {
                              pcVar4 = "size == BUF_SIZE";
                              uStack_60 = 0x4d;
                            }
                          }
                          else {
                            pcVar4 = "r == UV_ENOBUFS";
                            uStack_60 = 0x4c;
                          }
                        }
                        else {
                          pcVar4 = "size == BUF_SIZE - 1";
                          uStack_60 = 0x46;
                        }
                      }
                      else {
                        pcVar4 = "strcmp(buf, \"123456789\") == 0";
                        uStack_60 = 0x45;
                      }
                    }
                    else {
                      pcVar4 = "r == 0";
                      uStack_60 = 0x44;
                    }
                  }
                  else {
                    pcVar4 = "r == 0";
                    uStack_60 = 0x3e;
                  }
                }
                else {
                  pcVar4 = "r == UV_EINVAL";
                  uStack_60 = 0x3a;
                }
              }
              else {
                pcVar4 = "r == UV_EINVAL";
                uStack_60 = 0x36;
              }
            }
            else {
              pcVar4 = "r == UV_EINVAL";
              uStack_60 = 0x33;
            }
          }
          else {
            pcVar4 = "r == UV_EINVAL";
            uStack_60 = 0x31;
          }
        }
        else {
          pcVar4 = "r == UV_EINVAL";
          uStack_60 = 0x2f;
        }
      }
      else {
        pcVar4 = "r == UV_EINVAL";
        uStack_60 = 0x2a;
      }
    }
    else {
      pcVar4 = "r == UV_EINVAL";
      uStack_60 = 0x28;
    }
  }
  else {
    pcVar4 = "r == UV_EINVAL";
    uStack_60 = 0x26;
  }
LAB_00116fbf:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-env-vars.c"
          ,uStack_60,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(env_vars) {
  const char* name = "UV_TEST_FOO";
  const char* name2 = "UV_TEST_FOO2";
  char buf[BUF_SIZE];
  size_t size;
  int i, r, envcount, found, found_win_special;
  uv_env_item_t* envitems;

  /* Reject invalid inputs when setting an environment variable */
  r = uv_os_setenv(NULL, "foo");
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(name, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(NULL, NULL);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when retrieving an environment variable */
  size = BUF_SIZE;
  r = uv_os_getenv(NULL, buf, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, NULL, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, buf, NULL);
  ASSERT(r == UV_EINVAL);
  size = 0;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when deleting an environment variable */
  r = uv_os_unsetenv(NULL);
  ASSERT(r == UV_EINVAL);

  /* Successfully set an environment variable */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);

  /* Successfully read an environment variable */
  size = BUF_SIZE;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(strcmp(buf, "123456789") == 0);
  ASSERT(size == BUF_SIZE - 1);

  /* Return UV_ENOBUFS if the buffer cannot hold the environment variable */
  size = BUF_SIZE - 1;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(size == BUF_SIZE);

  /* Successfully delete an environment variable */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Return UV_ENOENT retrieving an environment variable that does not exist */
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOENT);

  /* Successfully delete an environment variable that does not exist */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Setting an environment variable to the empty string does not delete it. */
  r = uv_os_setenv(name, "");
  ASSERT(r == 0);
  size = BUF_SIZE;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(strlen(buf) == 0);

  /* Check getting all env variables. */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);
  r = uv_os_setenv(name2, "");
  ASSERT(r == 0);
#ifdef _WIN32
  /* Create a special environment variable on Windows in case there are no
     naturally occurring ones. */
  r = uv_os_setenv("=Z:", "\\");
  ASSERT(r == 0);
#endif

  r = uv_os_environ(&envitems, &envcount);
  ASSERT(r == 0);
  ASSERT(envcount > 0);

  found = 0;
  found_win_special = 0;

  for (i = 0; i < envcount; i++) {
    /* printf("Env: %s = %s\n", envitems[i].name, envitems[i].value); */
    if (strcmp(envitems[i].name, name) == 0) {
      found++;
      ASSERT(strcmp(envitems[i].value, "123456789") == 0);
    } else if (strcmp(envitems[i].name, name2) == 0) {
      found++;
      ASSERT(strlen(envitems[i].value) == 0);
    } else if (envitems[i].name[0] == '=') {
      found_win_special++;
    }
  }

  ASSERT(found == 2);
#ifdef _WIN32
  ASSERT(found_win_special > 0);
#endif

  uv_os_free_environ(envitems, envcount);

  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  r = uv_os_unsetenv(name2);
  ASSERT(r == 0);

  return 0;
}